

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNames.c
# Opt level: O0

void Abc_NtkMoveNames(Abc_Ntk_t *pNtk,Abc_Ntk_t *pOld)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Nm_Man_t *pNVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  Abc_Obj_t *pAVar7;
  char *pcVar8;
  int local_24;
  int i;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pOld_local;
  Abc_Ntk_t *pNtk_local;
  
  Nm_ManFree(pNtk->pManName);
  iVar1 = Abc_NtkCiNum(pNtk);
  iVar2 = Abc_NtkCoNum(pNtk);
  iVar3 = Abc_NtkBoxNum(pNtk);
  pNVar4 = Nm_ManCreate(iVar1 + iVar2 + iVar3);
  pNtk->pManName = pNVar4;
  for (local_24 = 0; iVar1 = Abc_NtkPiNum(pNtk), local_24 < iVar1; local_24 = local_24 + 1) {
    pAVar5 = Abc_NtkPi(pNtk,local_24);
    pAVar6 = Abc_NtkPi(pOld,local_24);
    pcVar8 = Abc_ObjName(pAVar6);
    Abc_ObjAssignName(pAVar5,pcVar8,(char *)0x0);
  }
  for (local_24 = 0; iVar1 = Abc_NtkPoNum(pNtk), local_24 < iVar1; local_24 = local_24 + 1) {
    pAVar5 = Abc_NtkPo(pNtk,local_24);
    pAVar6 = Abc_NtkPo(pOld,local_24);
    pcVar8 = Abc_ObjName(pAVar6);
    Abc_ObjAssignName(pAVar5,pcVar8,(char *)0x0);
  }
  for (local_24 = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), local_24 < iVar1; local_24 = local_24 + 1) {
    pAVar5 = Abc_NtkBox(pNtk,local_24);
    iVar1 = Abc_ObjIsLatch(pAVar5);
    if (iVar1 != 0) {
      pAVar6 = Abc_ObjFanin0(pAVar5);
      pAVar7 = Abc_NtkBox(pOld,local_24);
      pAVar7 = Abc_ObjFanin0(pAVar7);
      pcVar8 = Abc_ObjName(pAVar7);
      Abc_ObjAssignName(pAVar6,pcVar8,(char *)0x0);
      pAVar5 = Abc_ObjFanout0(pAVar5);
      pAVar6 = Abc_NtkBox(pOld,local_24);
      pAVar6 = Abc_ObjFanout0(pAVar6);
      pcVar8 = Abc_ObjName(pAVar6);
      Abc_ObjAssignName(pAVar5,pcVar8,(char *)0x0);
    }
  }
  Abc_NtkRedirectCiCo(pNtk);
  return;
}

Assistant:

void Abc_NtkMoveNames( Abc_Ntk_t * pNtk, Abc_Ntk_t * pOld )
{
    Abc_Obj_t * pObj; int i;
    Nm_ManFree( pNtk->pManName );
    pNtk->pManName = Nm_ManCreate( Abc_NtkCiNum(pNtk) + Abc_NtkCoNum(pNtk) + Abc_NtkBoxNum(pNtk) );
    Abc_NtkForEachPi( pNtk, pObj, i )
        Abc_ObjAssignName( pObj, Abc_ObjName(Abc_NtkPi(pOld, i)), NULL );
    Abc_NtkForEachPo( pNtk, pObj, i )
        Abc_ObjAssignName( pObj, Abc_ObjName(Abc_NtkPo(pOld, i)), NULL );
    Abc_NtkForEachLatch( pNtk, pObj, i )
    {
        Abc_ObjAssignName( Abc_ObjFanin0(pObj),  Abc_ObjName(Abc_ObjFanin0(Abc_NtkBox(pOld, i))),  NULL );
        Abc_ObjAssignName( Abc_ObjFanout0(pObj), Abc_ObjName(Abc_ObjFanout0(Abc_NtkBox(pOld, i))), NULL );
    }
    Abc_NtkRedirectCiCo( pNtk );
}